

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp fmt::v5::internal::operator*(fp x,fp y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  fp fVar7;
  uint64_t mid;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mask;
  fp y_local;
  fp x_local;
  undefined4 local_10;
  
  x_local.f._0_4_ = x.e;
  uVar1 = x.f >> 0x20;
  uVar3 = x.f & 0xffffffff;
  uVar2 = y.f >> 0x20;
  uVar4 = y.f & 0xffffffff;
  uVar5 = uVar3 * uVar2;
  uVar6 = uVar1 * uVar4;
  fp::fp((fp *)&x_local.e,
         uVar1 * uVar2 + (uVar6 >> 0x20) + (uVar5 >> 0x20) +
         ((uVar3 * uVar4 >> 0x20) + (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff) + 0x80000000 >> 0x20
         ),(int)x_local.f + 0x40 + y.e);
  fVar7._12_4_ = 0;
  fVar7.f = x_local._8_8_;
  fVar7.e = local_10;
  return fVar7;
}

Assistant:

FMT_FUNC fp operator*(fp x, fp y) {
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = x.f >> 32, b = x.f & mask;
  uint64_t c = y.f >> 32, d = y.f & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return fp(ac + (ad >> 32) + (bc >> 32) + (mid >> 32), x.e + y.e + 64);
}